

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O0

void StartFloorSound(sector_t_conflict *sec)

{
  sector_t_conflict *sec_00;
  bool bVar1;
  FName local_14;
  sector_t_conflict *local_10;
  sector_t_conflict *sec_local;
  
  if ((sec->Flags & 0x40) == 0) {
    local_10 = sec;
    if (sec->seqType < 0) {
      bVar1 = FName::operator!=(&(sec->SeqName).super_FName,NAME_None);
      sec_00 = local_10;
      if (bVar1) {
        FName::FName(&local_14,&(local_10->SeqName).super_FName);
        SN_StartSequence((sector_t *)sec_00,1,&local_14,0);
      }
      else {
        SN_StartSequence((sector_t *)local_10,1,"Floor",0);
      }
    }
    else {
      SN_StartSequence((sector_t *)sec,1,(int)sec->seqType,SEQ_PLATFORM,0,false);
    }
  }
  return;
}

Assistant:

static void StartFloorSound (sector_t *sec)
{
	if (sec->Flags & SECF_SILENTMOVE) return;

	if (sec->seqType >= 0)
	{
		SN_StartSequence (sec, CHAN_FLOOR, sec->seqType, SEQ_PLATFORM, 0);
	}
	else if (sec->SeqName != NAME_None)
	{
		SN_StartSequence (sec, CHAN_FLOOR, sec->SeqName, 0);
	}
	else
	{
		SN_StartSequence (sec, CHAN_FLOOR, "Floor", 0);
	}
}